

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Zyx_SetConstVar(Zyx_Man_t *p,int Var,int Value)

{
  int iVar1;
  int local_1c;
  int status;
  int iLit;
  int Value_local;
  int Var_local;
  Zyx_Man_t *p_local;
  
  status = Value;
  iLit = Var;
  _Value_local = p;
  local_1c = Abc_Var2Lit(Var,(uint)((Value != 0 ^ 0xffU) & 1));
  iVar1 = bmcg_sat_solver_addclause(_Value_local->pSat,&local_1c,1);
  if (iVar1 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x26f,"void Zyx_SetConstVar(Zyx_Man_t *, int, int)");
  }
  iVar1 = Vec_IntEntry(_Value_local->vVarValues,iLit);
  if (iVar1 == -1) {
    Vec_IntWriteEntry(_Value_local->vVarValues,iLit,status);
    return;
  }
  __assert_fail("Vec_IntEntry(p->vVarValues, Var) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                ,0x270,"void Zyx_SetConstVar(Zyx_Man_t *, int, int)");
}

Assistant:

void Zyx_SetConstVar( Zyx_Man_t * p, int Var, int Value )
{
    int iLit = Abc_Var2Lit( Var, !Value );
    int status = bmcg_sat_solver_addclause( p->pSat, &iLit, 1 );
    assert( status );
    assert( Vec_IntEntry(p->vVarValues, Var) == -1 );
    Vec_IntWriteEntry( p->vVarValues, Var, Value );
    //printf( "Setting var %d to value %d.\n", Var, Value );
}